

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

bool slang::analysis::hasUnusedAttrib(Compilation *compilation,Symbol *symbol)

{
  AttributeSymbol *this;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  long lVar1;
  bool bVar2;
  byte bVar3;
  pointer ppAVar4;
  ConstantValue *this_00;
  long lVar5;
  long lVar6;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar7;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  
  sVar7 = ast::Compilation::getAttributes(compilation,symbol);
  lVar6 = sVar7._M_extent._M_extent_value._M_extent_value << 3;
  ppAVar4 = sVar7._M_ptr;
  lVar1 = 0;
  do {
    lVar5 = lVar1;
    bVar3 = (byte)ppAVar4;
    if (lVar6 == lVar5) goto LAB_00509031;
    this = *(AttributeSymbol **)((long)sVar7._M_ptr + lVar5);
    __x._M_len = (this->super_Symbol).name._M_len;
    __x._M_str = (this->super_Symbol).name._M_str;
    __y._M_str = "unused";
    __y._M_len = 6;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) break;
    __x_00._M_len = (this->super_Symbol).name._M_len;
    __x_00._M_str = (this->super_Symbol).name._M_str;
    __y_00._M_str = "maybe_unused";
    __y_00._M_len = 0xc;
    bVar2 = std::operator==(__x_00,__y_00);
    ppAVar4 = (pointer)(ulong)bVar2;
    lVar1 = lVar5 + 8;
  } while (!bVar2);
  this_00 = ast::AttributeSymbol::getValue(this);
  bVar3 = ConstantValue::isTrue(this_00);
LAB_00509031:
  return (bool)(lVar6 != lVar5 & bVar3);
}

Assistant:

static bool hasUnusedAttrib(const Compilation& compilation, const Symbol& symbol) {
    for (auto attr : compilation.getAttributes(symbol)) {
        if (attr->name == "unused"sv || attr->name == "maybe_unused"sv)
            return attr->getValue().isTrue();
    }
    return false;
}